

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

int __thiscall
QTextDocumentPrivate::insertBlock
          (QTextDocumentPrivate *this,QChar blockSeparator,int pos,int blockFormat,int charFormat,
          Operation op)

{
  BlockMap *this_00;
  uint *puVar1;
  Header *pHVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint p_1;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  uint local_98;
  undefined1 local_78 [3];
  quint8 qStack_75;
  int iStack_74;
  uint uStack_70;
  int iStack_6c;
  int local_68;
  undefined4 uStack_64;
  quint32 qStack_60;
  undefined4 uStack_5c;
  QTextFormat local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = this->editBlock;
  this->editBlock = iVar8 + 1;
  if (iVar8 == 0) {
    this->revision = this->revision + 1;
  }
  uVar7 = (uint)(this->text).d.size;
  QString::append((QChar)((short)this + L'\x80'));
  this_00 = &this->blocks;
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  if (uVar6 == 0) {
    bVar13 = true;
    bVar12 = false;
    local_98 = 0;
  }
  else {
    pHVar2 = (this_00->data).field_0.head;
    uVar9 = (ulong)uVar6;
    iVar8 = *(int *)((long)pHVar2 + uVar9 * 0x48 + 0x10);
    uVar10 = *(uint *)((long)pHVar2 + uVar9 * 0x48);
    uVar5 = uVar10;
    iVar11 = iVar8;
    uVar4 = uVar6;
    while (uVar3 = uVar5, uVar3 != 0) {
      puVar1 = (uint *)((long)pHVar2 + (ulong)uVar3 * 0x48);
      if (puVar1[2] == uVar4) {
        iVar11 = iVar11 + puVar1[4] + puVar1[7];
      }
      uVar4 = uVar3;
      uVar5 = *puVar1;
    }
    bVar12 = pos - iVar11 != *(int *)((long)pHVar2 + uVar9 * 0x48 + 0x1c) + -1;
    while (uVar10 != 0) {
      puVar1 = (uint *)((long)pHVar2 + (ulong)uVar10 * 0x48);
      if (puVar1[2] == uVar6) {
        iVar8 = iVar8 + puVar1[4] + puVar1[7];
      }
      uVar6 = uVar10;
      uVar10 = *puVar1;
    }
    bVar13 = iVar8 == pos;
    local_98 = *(int *)((long)pHVar2 + uVar9 * 0x48 + 0x44) * 2 >> 1;
  }
  iVar8 = insert_block(this,pos,uVar7,charFormat,blockFormat,op,5);
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  pHVar2 = (this->blocks).data.field_0.head;
  local_78[2] = this->editBlock != 0;
  local_78._0_2_ = 4;
  uVar9 = (ulong)uVar6;
  qStack_75 = (quint8)op;
  iStack_74 = charFormat;
  iStack_6c = pos;
  uStack_70 = uVar7;
  uStack_64 = 0xaaaaaaaa;
  local_68 = blockFormat;
  uStack_5c = 0xaaaaaaaa;
  qStack_60 = *(int *)((long)pHVar2 + uVar9 * 0x48 + 0x44) * 2 >> 1;
  appendUndoItem(this,(QTextUndoCommand *)local_78);
  uVar10 = local_98;
  if (bVar12) {
    uVar10 = this->revision;
  }
  if (bVar13) {
    uVar10 = this->revision;
  }
  *(uint *)((long)pHVar2 + uVar9 * 0x48 + 0x44) =
       *(uint *)((long)pHVar2 + uVar9 * 0x48 + 0x44) & 0x80000000 | uVar10 & 0x7fffffff;
  uVar7 = QFragmentMapData<QTextBlockData>::next(&this_00->data,uVar6);
  if (uVar7 != 0) {
    pHVar2 = (this->blocks).data.field_0.head;
    if (!bVar13) {
      local_98 = this->revision;
    }
    *(uint *)((long)pHVar2 + (ulong)uVar7 * 0x48 + 0x44) =
         *(uint *)((long)pHVar2 + (ulong)uVar7 * 0x48 + 0x44) & 0x80000000 | local_98 & 0x7fffffff;
  }
  QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)this + 0xe8);
  QTextFormat::toCharFormat(&local_58);
  QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
  iVar11 = QTextFormat::objectIndex(&local_58);
  QTextFormat::~QTextFormat(&local_58);
  if (iVar11 == -1) {
    this->field_0x294 = this->field_0x294 | 1;
  }
  endEditBlock(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

int QTextDocumentPrivate::insertBlock(QChar blockSeparator,
                                  int pos, int blockFormat, int charFormat, QTextUndoCommand::Operation op)
{
    Q_ASSERT(formats.format(blockFormat).isBlockFormat());
    Q_ASSERT(formats.format(charFormat).isCharFormat());
    Q_ASSERT(pos >= 0 && (pos < fragments.length() || (pos == 0 && fragments.length() == 0)));
    Q_ASSERT(isValidBlockSeparator(blockSeparator));

    beginEditBlock();

    int strPos = text.size();
    text.append(blockSeparator);

    int ob = blocks.findNode(pos);
    bool atBlockEnd = true;
    bool atBlockStart = true;
    int oldRevision = 0;
    if (ob) {
        atBlockEnd = (pos - blocks.position(ob) == blocks.size(ob)-1);
        atBlockStart = ((int)blocks.position(ob) == pos);
        oldRevision = blocks.fragment(ob)->revision;
    }

    const int fragment = insert_block(pos, strPos, charFormat, blockFormat, op, QTextUndoCommand::BlockRemoved);

    Q_ASSERT(blocks.length() == fragments.length());

    int b = blocks.findNode(pos);
    QTextBlockData *B = blocks.fragment(b);

    QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::BlockInserted, (editBlock != 0),
                            op, charFormat, strPos, pos, blockFormat,
                            B->revision);

    appendUndoItem(c);
    Q_ASSERT(undoState == undoStack.size());

    // update revision numbers of the modified blocks.
    B->revision = (atBlockEnd && !atBlockStart)? oldRevision : revision;
    b = blocks.next(b);
    if (b) {
        B = blocks.fragment(b);
        B->revision = atBlockStart ? oldRevision : revision;
    }

    if (formats.charFormat(charFormat).objectIndex() == -1)
        needsEnsureMaximumBlockCount = true;

    endEditBlock();
    return fragment;
}